

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall
Executor::handleVariableCall
          (Executor *this,FunctionCallNode *node,RuntimeVariableAnalyser *variableAnalyser)

{
  element_type *peVar1;
  Executor *this_00;
  RuntimeVariableAnalyser *in_RDX;
  FunctionCallNode *in_RSI;
  Executor executor;
  shared_ptr<ExpressionNode> value;
  Value *in_stack_00000308;
  string *in_stack_00000310;
  CallNode *in_stack_00000318;
  Executor *in_stack_00000320;
  shared_ptr<ExpressionNode> *in_stack_fffffffffffffd68;
  shared_ptr<ExpressionNode> *in_stack_fffffffffffffd70;
  Context *in_stack_fffffffffffffd98;
  Executor *in_stack_fffffffffffffda0;
  Executor local_258;
  FunctionCallNode *local_10;
  
  local_10 = in_RSI;
  RuntimeVariableAnalyser::getValue(in_RDX);
  std::shared_ptr<ExpressionNode>::shared_ptr(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  RuntimeVariableAnalyser::getContext((RuntimeVariableAnalyser *)0x18ac86);
  Executor(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  peVar1 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x18acab);
  (*(peVar1->super_Node)._vptr_Node[2])(peVar1,&local_258);
  FunctionCallNode::getName_abi_cxx11_(local_10);
  this_00 = (Executor *)getValue(&local_258);
  std::unique_ptr<Value,_std::default_delete<Value>_>::operator*
            ((unique_ptr<Value,_std::default_delete<Value>_> *)this_00);
  callValue(in_stack_00000320,in_stack_00000318,in_stack_00000310,in_stack_00000308);
  ~Executor(this_00);
  std::shared_ptr<ExpressionNode>::~shared_ptr((shared_ptr<ExpressionNode> *)0x18ad29);
  return;
}

Assistant:

void Executor::handleVariableCall(const FunctionCallNode& node, const RuntimeVariableAnalyser& variableAnalyser)
{
  const auto value = variableAnalyser.getValue();
  auto executor = Executor{variableAnalyser.getContext()};
  value->accept(executor);

  callValue(node, node.getName(), *executor.getValue());
}